

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

int32_t __thiscall
icu_63::BMPSet::spanBackUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  int iVar1;
  UBool UVar2;
  uint c_00;
  uint uVar3;
  int iVar4;
  uint32_t twoBits;
  int lead;
  UChar32 c;
  int32_t prev;
  int32_t iStack_24;
  uint8_t b;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  uint8_t *s_local;
  BMPSet *this_local;
  
  iStack_24 = length;
  _spanCondition_local = s;
  s_local = (uint8_t *)this;
  prev = spanCondition;
  if (spanCondition != USET_SPAN_NOT_CONTAINED) {
    prev = 1;
  }
  do {
    iStack_24 = iStack_24 + -1;
    c._3_1_ = _spanCondition_local[iStack_24];
    if ((c._3_1_ & 0x80) == 0) {
      if (prev == 0) {
        do {
          if (this->latin1Contains[c._3_1_] != '\0') {
            return iStack_24 + 1;
          }
          if (iStack_24 == 0) {
            return 0;
          }
          iStack_24 = iStack_24 + -1;
          c._3_1_ = _spanCondition_local[iStack_24];
        } while ((c._3_1_ & 0x80) == 0);
      }
      else {
        do {
          if (this->latin1Contains[c._3_1_] == '\0') {
            return iStack_24 + 1;
          }
          if (iStack_24 == 0) {
            return 0;
          }
          iStack_24 = iStack_24 + -1;
          c._3_1_ = _spanCondition_local[iStack_24];
        } while ((c._3_1_ & 0x80) == 0);
      }
    }
    iVar1 = iStack_24;
    c_00 = utf8_prevCharSafeBody_63
                     (_spanCondition_local,0,&stack0xffffffffffffffdc,(uint)c._3_1_,-3);
    if ((int)c_00 < 0x800) {
      if ((uint)((this->table7FF[(int)(c_00 & 0x3f)] & 1 << ((byte)((int)c_00 >> 6) & 0x1f)) != 0)
          != prev) {
        return iVar1 + 1;
      }
    }
    else if ((int)c_00 < 0x10000) {
      iVar4 = (int)c_00 >> 0xc;
      uVar3 = this->bmpBlockBits[(int)((int)c_00 >> 6 & 0x3f)] >> ((byte)iVar4 & 0x1f) & 0x10001;
      if (uVar3 < 2) {
        if (uVar3 != prev) {
          return iVar1 + 1;
        }
      }
      else {
        UVar2 = containsSlow(this,c_00,this->list4kStarts[iVar4],this->list4kStarts[iVar4 + 1]);
        if (UVar2 != prev) {
          return iVar1 + 1;
        }
      }
    }
    else {
      UVar2 = containsSlow(this,c_00,this->list4kStarts[0x10],this->list4kStarts[0x11]);
      if (UVar2 != prev) {
        return iVar1 + 1;
      }
    }
  } while (0 < iStack_24);
  return 0;
}

Assistant:

int32_t
BMPSet::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    uint8_t b;

    do {
        b=s[--length];
        if(U8_IS_SINGLE(b)) {
            // ASCII sub-span
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            }
        }

        int32_t prev=length;
        UChar32 c;
        // trail byte: collect a multi-byte character
        // (or  lead byte in last-trail position)
        c=utf8_prevCharSafeBody(s, 0, &length, b, -3);
        // c is a valid code point, not ASCII, not a surrogate
        if(c<=0x7ff) {
            if((USetSpanCondition)((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) != spanCondition) {
                return prev+1;
            }
        } else if(c<=0xffff) {
            int lead=c>>12;
            uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
            if(twoBits<=1) {
                // All 64 code points with the same bits 15..6
                // are either in the set or not.
                if(twoBits!=(uint32_t)spanCondition) {
                    return prev+1;
                }
            } else {
                // Look up the code point in its 4k block of code points.
                if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1]) != spanCondition) {
                    return prev+1;
                }
            }
        } else {
            if(containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) != spanCondition) {
                return prev+1;
            }
        }
    } while(length>0);
    return 0;
}